

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O1

void ring_bell(tgestate_t *state)

{
  uint8_t *dst;
  bellring_t bVar1;
  
  bVar1 = state->bell;
  if (bVar1 != '\0') {
    if (bVar1 != 0xff) {
      state->bell = bVar1 + 0xff;
      if ((bellring_t)(bVar1 + 0xff) != '\0') goto LAB_00107729;
      state->bell = 0xff;
    }
    return;
  }
LAB_00107729:
  dst = (state->speccy->screen).pixels + 0x118e;
  if ((state->speccy->screen).pixels[0x118e] == '?') {
    plot_bitmap(state,ring_bell::bell_ringer_bitmap_off,dst,'\x01','\f');
    return;
  }
  plot_bitmap(state,"??\'\x13\x13\t\b\x04\x04\x02\x02\x01",dst,'\x01','\f');
  play_speaker(state,sound_BELL_RINGER);
  return;
}

Assistant:

void ring_bell(tgestate_t *state)
{
  /**
   * $A147: Bell ringer bitmaps.
   */
  static const uint8_t bell_ringer_bitmap_off[] =
  {
    0xE7, 0xE7, 0x83, 0x83, 0x43, 0x41, 0x20, 0x10, 0x08, 0x04, 0x02, 0x02
  };
  static const uint8_t bell_ringer_bitmap_on[] =
  {
    0x3F, 0x3F, 0x27, 0x13, 0x13, 0x09, 0x08, 0x04, 0x04, 0x02, 0x02, 0x01
  };

  bellring_t *pbell; /* was HL */
  bellring_t  bell;  /* was A */

  assert(state != NULL);

  pbell = &state->bell;
  bell = *pbell;
  if (bell == bell_STOP)
    return; /* Not ringing */

  if (bell != bell_RING_PERPETUAL)
  {
    /* Decrement the ring counter. */
    *pbell = --bell;
    if (bell == 0)
    {
      /* Counter hit zero - stop ringing. */
      *pbell = bell_STOP;
      return;
    }
  }

  /* Fetch visible state of bell. */
  bell = state->speccy->screen.pixels[screenoffset_BELL_RINGER];
  if (bell != 0x3F) /* Pixel value is 0x3F if on */
  {
    /* Plot ringer "on". */
    plot_ringer(state, bell_ringer_bitmap_on);
    play_speaker(state, sound_BELL_RINGER);
  }
  else
  {
    /* Plot ringer "off". */
    plot_ringer(state, bell_ringer_bitmap_off);
  }
}